

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregator.cpp
# Opt level: O2

void duckdb::WindowAggregatorLocalState::InitSubFrames
               (SubFrames *frames,WindowExcludeMode exclude_mode)

{
  size_type __new_size;
  value_type local_18;
  
  if (exclude_mode < 4) {
    __new_size = *(size_type *)(&DAT_02041798 + (ulong)exclude_mode * 8);
  }
  else {
    __new_size = 0;
  }
  local_18.start = 0;
  local_18.end = 0;
  ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::resize
            (&frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>,
             __new_size,&local_18);
  return;
}

Assistant:

void WindowAggregatorLocalState::InitSubFrames(SubFrames &frames, const WindowExcludeMode exclude_mode) {
	idx_t nframes = 0;
	switch (exclude_mode) {
	case WindowExcludeMode::NO_OTHER:
		nframes = 1;
		break;
	case WindowExcludeMode::TIES:
		nframes = 3;
		break;
	case WindowExcludeMode::CURRENT_ROW:
	case WindowExcludeMode::GROUP:
		nframes = 2;
		break;
	}
	frames.resize(nframes, {0, 0});
}